

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cc
# Opt level: O2

void anon_unknown.dwarf_56160::replace(string *str,string *keyword,subst *fn)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  runtime_error *this;
  string suffix;
  string prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> replace;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> mod;
  string local_50;
  
  std::operator+(&suffix,"{",keyword);
  std::operator+(&prefix,&suffix,":");
  std::__cxx11::string::~string((string *)&suffix);
  std::__cxx11::string::string((string *)&suffix,"}",(allocator *)&replace);
  do {
    uVar2 = std::__cxx11::string::find((string *)str,(ulong)&prefix);
    if (uVar2 == 0xffffffffffffffff) {
      std::__cxx11::string::~string((string *)&suffix);
      std::__cxx11::string::~string((string *)&prefix);
      return;
    }
    uVar3 = std::__cxx11::string::find((string *)str,(ulong)&suffix);
    if (uVar3 == 0xffffffffffffffff) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Invalid pattern");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar4 = std::__cxx11::string::find((char)str,0x7c);
    std::__cxx11::string::substr((ulong)&mod,(ulong)str);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator()(&replace,fn,&mod);
    std::__cxx11::string::~string((string *)&mod);
    if (uVar4 < uVar3) {
      std::__cxx11::string::substr((ulong)&mod,(ulong)str);
      bVar1 = std::operator==(&mod,"upper");
      if (bVar1) {
        util::toUpper(&local_50,&replace);
LAB_00177051:
        std::__cxx11::string::operator=((string *)&replace,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
      }
      else {
        bVar1 = std::operator==(&mod,"lower");
        if (bVar1) {
          util::toLower(&local_50,&replace);
          goto LAB_00177051;
        }
      }
      std::__cxx11::string::~string((string *)&mod);
    }
    std::__cxx11::string::replace((ulong)str,uVar2,(string *)((uVar3 - uVar2) + 1));
    std::__cxx11::string::~string((string *)&replace);
  } while( true );
}

Assistant:

void replace(std::string& str, const std::string& keyword, subst fn) {
  std::string::size_type lpos = 0u;
  std::string::size_type rpos = 0u;
  const std::string prefix = "{" + keyword + ":";
  const std::string suffix = "}";
  while ((lpos = str.find(prefix, lpos)) != std::string::npos) {
    // Find corresponding suffix
    rpos = str.find(suffix, lpos + prefix.length());
    if (rpos == std::string::npos) {
      throw std::runtime_error("Invalid pattern");
    }

    // Lookup modifier (if any)
    auto mlpos = str.find('|', lpos + prefix.length());
    auto mrpos = rpos;
    auto mok = (mlpos != std::string::npos && mlpos < rpos);

    // Lookup replacement
    auto klpos = lpos + prefix.length();
    auto krpos = mok ? mlpos : rpos;
    auto replace = fn(str.substr(klpos, krpos - klpos));

    // Apply modifier (if applicable)
    if (mok) {
      auto mod = str.substr(mlpos + 1, mrpos - (mlpos + 1));
      if (mod == "upper") {
        replace = toUpper(replace);
      } else if (mod == "lower") {
        replace = toLower(replace);
      }
    }

    // Replace
    str.replace(lpos, rpos - lpos + 1, replace);
    lpos += replace.length();
  }
}